

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O2

void VP8LPutBitsInternal(VP8LBitWriter *bw,uint32_t bits,int n_bits)

{
  int iVar1;
  uint8_t *puVar2;
  vp8l_atype_t vVar3;
  int iVar4;
  
  if (0 < n_bits) {
    vVar3 = bw->bits;
    for (iVar4 = bw->used; 0x1f < iVar4; iVar4 = iVar4 + -0x20) {
      puVar2 = bw->cur;
      if (bw->end < puVar2 + 4) {
        iVar1 = VP8LBitWriterResize(bw,(size_t)(bw->end + (0x8000 - (long)bw->buf)));
        if (iVar1 == 0) {
          bw->cur = bw->buf;
          bw->error = 1;
          return;
        }
        puVar2 = bw->cur;
      }
      *(int *)puVar2 = (int)vVar3;
      bw->cur = puVar2 + 4;
      vVar3 = vVar3 >> 0x20;
    }
    bw->bits = (ulong)bits << ((byte)iVar4 & 0x3f) | vVar3;
    bw->used = n_bits + iVar4;
  }
  return;
}

Assistant:

void VP8LPutBitsInternal(VP8LBitWriter* const bw, uint32_t bits, int n_bits) {
  assert(n_bits <= 32);
  // That's the max we can handle:
  assert(sizeof(vp8l_wtype_t) == 2);
  if (n_bits > 0) {
    vp8l_atype_t lbits = bw->bits;
    int used = bw->used;
    // Special case of overflow handling for 32bit accumulator (2-steps flush).
#if VP8L_WRITER_BITS == 16
    if (used + n_bits >= VP8L_WRITER_MAX_BITS) {
      // Fill up all the VP8L_WRITER_MAX_BITS so it can be flushed out below.
      const int shift = VP8L_WRITER_MAX_BITS - used;
      lbits |= (vp8l_atype_t)bits << used;
      used = VP8L_WRITER_MAX_BITS;
      n_bits -= shift;
      bits >>= shift;
      assert(n_bits <= VP8L_WRITER_MAX_BITS);
    }
#endif
    // If needed, make some room by flushing some bits out.
    while (used >= VP8L_WRITER_BITS) {
      if (bw->cur + VP8L_WRITER_BYTES > bw->end) {
        const uint64_t extra_size = (bw->end - bw->buf) + MIN_EXTRA_SIZE;
        if (!CheckSizeOverflow(extra_size) ||
            !VP8LBitWriterResize(bw, (size_t)extra_size)) {
          bw->cur = bw->buf;
          bw->error = 1;
          return;
        }
      }
      *(vp8l_wtype_t*)bw->cur = (vp8l_wtype_t)WSWAP((vp8l_wtype_t)lbits);
      bw->cur += VP8L_WRITER_BYTES;
      lbits >>= VP8L_WRITER_BITS;
      used -= VP8L_WRITER_BITS;
    }
    bw->bits = lbits | ((vp8l_atype_t)bits << used);
    bw->used = used + n_bits;
  }
}